

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

size_t gguf_get_arr_n(gguf_context *ctx,int64_t key_id)

{
  pointer pgVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  int line;
  
  if ((-1 < key_id) &&
     (pgVar1 = (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
               super__Vector_impl_data._M_start,
     lVar6 = ((long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pgVar1 >> 3) * 0x2e8ba2e8ba2e8ba3,
     lVar6 - key_id != 0 && key_id <= lVar6)) {
    if (pgVar1[key_id].type == GGUF_TYPE_STRING) {
      sVar2 = (long)*(pointer *)
                     ((long)&pgVar1[key_id].data_string.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl + 8) -
              *(long *)&pgVar1[key_id].data_string.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data >> 5;
    }
    else {
      sVar3 = gguf_type_size(pgVar1[key_id].type);
      uVar4 = (long)*(pointer *)
                     ((long)&pgVar1[key_id].data.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl +
                     8) -
              *(long *)&pgVar1[key_id].data.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data;
      sVar2 = uVar4 / sVar3;
      if (uVar4 % sVar3 != 0) {
        pcVar5 = "ctx->kv[key_id].data.size() % type_size == 0";
        line = 0x31e;
        goto LAB_0013d838;
      }
    }
    return sVar2;
  }
  pcVar5 = "key_id >= 0 && key_id < gguf_get_n_kv(ctx)";
  line = 0x317;
LAB_0013d838:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
             ,line,"GGML_ASSERT(%s) failed",pcVar5);
}

Assistant:

size_t gguf_get_arr_n(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));

    if (ctx->kv[key_id].type == GGUF_TYPE_STRING) {
        return ctx->kv[key_id].data_string.size();
    }

    const size_t type_size = gguf_type_size(ctx->kv[key_id].type);
    GGML_ASSERT(ctx->kv[key_id].data.size() % type_size == 0);
    return ctx->kv[key_id].data.size() / type_size;
}